

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

container_t * container_repair_after_lazy(container_t *c,uint8_t *type)

{
  container_t *pcVar1;
  byte *in_RSI;
  bitset_container_t *bc;
  container_t *result;
  container_t *in_stack_ffffffffffffffc8;
  
  get_writable_copy_if_shared(in_stack_ffffffffffffffc8,(uint8_t *)0x1665cd);
  pcVar1 = (container_t *)
           (*(code *)(&DAT_0017e694 + *(int *)(&DAT_0017e694 + (ulong)(*in_RSI - 1) * 4)))();
  return pcVar1;
}

Assistant:

static inline container_t *container_repair_after_lazy(container_t *c,
                                                       uint8_t *type) {
    c = get_writable_copy_if_shared(c, type);  // !!! unnecessary cloning
    container_t *result = NULL;
    switch (*type) {
        case BITSET_CONTAINER_TYPE: {
            bitset_container_t *bc = CAST_bitset(c);
            bc->cardinality = bitset_container_compute_cardinality(bc);
            if (bc->cardinality <= DEFAULT_MAX_SIZE) {
                result = array_container_from_bitset(bc);
                bitset_container_free(bc);
                *type = ARRAY_CONTAINER_TYPE;
                return result;
            }
            return c;
        }
        case ARRAY_CONTAINER_TYPE:
            return c;  // nothing to do
        case RUN_CONTAINER_TYPE:
            return convert_run_to_efficient_container_and_free(CAST_run(c),
                                                               type);
        case SHARED_CONTAINER_TYPE:
            assert(false);
    }
    assert(false);
    roaring_unreachable;
    return 0;  // unreached
}